

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O2

adt_error_t adt_ary_unshift(adt_ary_t *self,void *pElem)

{
  int iVar1;
  void **ppvVar2;
  adt_error_t aVar3;
  
  if (self == (adt_ary_t *)0x0) {
    return '\x01';
  }
  iVar1 = self->s32CurLen;
  aVar3 = '\x04';
  if (iVar1 != 0x7fffffff) {
    ppvVar2 = self->pFirst;
    if (self->ppAlloc < ppvVar2) {
      self->pFirst = ppvVar2 + -1;
      ppvVar2[-1] = pElem;
      self->s32CurLen = iVar1 + 1;
    }
    else {
      aVar3 = adt_ary_extend(self,iVar1 + 1);
      if (aVar3 != '\0') {
        return aVar3;
      }
      adt_block_memmove((uint8_t *)(self->pFirst + 1),(uint8_t *)self->pFirst,
                        self->s32CurLen * 8 - 8);
      *self->pFirst = pElem;
    }
    aVar3 = '\0';
  }
  return aVar3;
}

Assistant:

adt_error_t	adt_ary_unshift(adt_ary_t *self, void *pElem){
   if ( self != 0 ) {
      if (self->s32CurLen == INT32_MAX) {
         return ADT_LENGTH_ERROR; //cannot fit any more elements into the array
      }
      if(self->pFirst > self->ppAlloc){
         //room for one more element at the beginning
         *(--self->pFirst)=pElem;
         self->s32CurLen++;
         return ADT_NO_ERROR;
      }
      else {
         //no room at beginning of array, move all array data forward by one
         uint8_t *pBegin,*pEnd;
         adt_error_t result;
         uint32_t u32ElemSize = sizeof(void**);
         result = adt_ary_extend(self,(int32_t) (self->s32CurLen+1));
         if (result == ADT_NO_ERROR) {
            uint32_t u32Remain;
            pBegin = (uint8_t*) self->pFirst+u32ElemSize;
            pEnd = ((uint8_t*) &self->pFirst[self->s32CurLen]);
            u32Remain = (uint32_t) (pEnd-pBegin);
            adt_block_memmove(pBegin, (uint8_t*) self->pFirst, u32Remain);
            self->pFirst[0]=pElem;
         }
         return result;
      }
   }
	return ADT_INVALID_ARGUMENT_ERROR;
}